

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_dec_clnpass_step
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 oneplushalf,OPJ_UINT32 ci
               ,OPJ_UINT32 vsc)

{
  OPJ_UINT32 *pOVar1;
  opj_mqc_state_t *poVar2;
  OPJ_BYTE *pOVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint *puVar8;
  OPJ_UINT32 OVar9;
  int iVar10;
  OPJ_UINT32 OVar11;
  uint uVar12;
  opj_mqc_state_t **ppoVar13;
  uint uVar14;
  uint uVar15;
  
  bVar5 = (byte)(ci * 3);
  if ((*flagsp >> (bVar5 & 0x1f) & 0x200010) == 0) {
    ppoVar13 = (t1->mqc).ctxs + (t1->mqc).lut_ctxno_zc_orient[*flagsp >> (bVar5 & 0x1f) & 0x1ef];
    (t1->mqc).curctx = ppoVar13;
    poVar2 = *ppoVar13;
    uVar12 = poVar2->qeval;
    uVar7 = (t1->mqc).c;
    uVar14 = (t1->mqc).a - uVar12;
    (t1->mqc).a = uVar14;
    if (uVar7 >> 0x10 < uVar12) {
      (t1->mqc).a = uVar12;
      uVar7 = (uint)(poVar2->mps == 0);
      if (uVar12 > uVar14) {
        uVar7 = poVar2->mps;
      }
      *ppoVar13 = (&poVar2->nmps)[uVar12 <= uVar14];
      OVar9 = (t1->mqc).ct;
      OVar11 = (t1->mqc).c;
      uVar12 = (t1->mqc).a;
      do {
        if (OVar9 == 0) {
          pOVar3 = (t1->mqc).bp;
          bVar6 = pOVar3[1];
          if (*pOVar3 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar3 + 1;
              OVar11 = OVar11 + (uint)bVar6 * 0x200;
              (t1->mqc).c = OVar11;
              (t1->mqc).ct = 7;
              OVar9 = 7;
              goto LAB_001342b1;
            }
            OVar11 = OVar11 + 0xff00;
            (t1->mqc).c = OVar11;
            (t1->mqc).ct = 8;
            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar1 = *pOVar1 + 1;
          }
          else {
            (t1->mqc).bp = pOVar3 + 1;
            OVar11 = OVar11 + (uint)bVar6 * 0x100;
            (t1->mqc).c = OVar11;
            (t1->mqc).ct = 8;
          }
          OVar9 = 8;
        }
LAB_001342b1:
        uVar12 = uVar12 * 2;
        (t1->mqc).a = uVar12;
        OVar11 = OVar11 * 2;
        (t1->mqc).c = OVar11;
        OVar9 = OVar9 - 1;
        (t1->mqc).ct = OVar9;
      } while (uVar12 < 0x8000);
    }
    else {
      (t1->mqc).c = uVar7 + uVar12 * -0x10000;
      if ((short)uVar14 < 0) {
        uVar7 = poVar2->mps;
      }
      else {
        uVar7 = (uint)(poVar2->mps == 0);
        if (uVar14 >= uVar12) {
          uVar7 = poVar2->mps;
        }
        *ppoVar13 = (&poVar2->nmps)[uVar14 < uVar12];
        OVar9 = (t1->mqc).ct;
        OVar11 = (t1->mqc).c;
        uVar12 = (t1->mqc).a;
        do {
          if (OVar9 == 0) {
            pOVar3 = (t1->mqc).bp;
            bVar6 = pOVar3[1];
            if (*pOVar3 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar3 + 1;
                OVar11 = OVar11 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar11;
                (t1->mqc).ct = 7;
                OVar9 = 7;
                goto LAB_00134376;
              }
              OVar11 = OVar11 + 0xff00;
              (t1->mqc).c = OVar11;
              (t1->mqc).ct = 8;
              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar1 = *pOVar1 + 1;
            }
            else {
              (t1->mqc).bp = pOVar3 + 1;
              OVar11 = OVar11 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar11;
              (t1->mqc).ct = 8;
            }
            OVar9 = 8;
          }
LAB_00134376:
          uVar12 = uVar12 * 2;
          (t1->mqc).a = uVar12;
          OVar11 = OVar11 * 2;
          (t1->mqc).c = OVar11;
          OVar9 = OVar9 - 1;
          (t1->mqc).ct = OVar9;
        } while (uVar12 < 0x8000);
      }
    }
    if (uVar7 != 0) {
      uVar12 = *flagsp;
      bVar6 = 0xe;
      if (ci != 0) {
        bVar6 = bVar5 + 0xc;
      }
      uVar14 = uVar12 >> (bVar5 + 0x10 & 0x1f) & 0x40 | uVar12 >> (bVar5 & 0x1f) & 0xaa |
               uVar12 >> (bVar6 & 0x1f) & 0x10 |
               (uint)((flagsp[-1] >> (ci * 3 + 0x13 & 0x1f) & 1) != 0) |
               flagsp[1] >> (bVar5 + 0x11 & 0x1f) & 4;
      bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
              [uVar14];
      ppoVar13 = (t1->mqc).ctxs + bVar6;
      (t1->mqc).curctx = ppoVar13;
      poVar2 = (t1->mqc).ctxs[bVar6];
      uVar12 = poVar2->qeval;
      uVar7 = (t1->mqc).c;
      uVar15 = (t1->mqc).a - uVar12;
      (t1->mqc).a = uVar15;
      if (uVar7 >> 0x10 < uVar12) {
        (t1->mqc).a = uVar12;
        uVar7 = (uint)(poVar2->mps == 0);
        if (uVar12 > uVar15) {
          uVar7 = poVar2->mps;
        }
        *ppoVar13 = (&poVar2->nmps)[uVar12 <= uVar15];
        OVar9 = (t1->mqc).ct;
        OVar11 = (t1->mqc).c;
        uVar12 = (t1->mqc).a;
        do {
          if (OVar9 == 0) {
            pOVar3 = (t1->mqc).bp;
            bVar6 = pOVar3[1];
            if (*pOVar3 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar3 + 1;
                OVar11 = OVar11 + (uint)bVar6 * 0x200;
                (t1->mqc).c = OVar11;
                (t1->mqc).ct = 7;
                OVar9 = 7;
                goto LAB_001344d7;
              }
              OVar11 = OVar11 + 0xff00;
              (t1->mqc).c = OVar11;
              (t1->mqc).ct = 8;
              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar1 = *pOVar1 + 1;
            }
            else {
              (t1->mqc).bp = pOVar3 + 1;
              OVar11 = OVar11 + (uint)bVar6 * 0x100;
              (t1->mqc).c = OVar11;
              (t1->mqc).ct = 8;
            }
            OVar9 = 8;
          }
LAB_001344d7:
          uVar12 = uVar12 * 2;
          (t1->mqc).a = uVar12;
          OVar11 = OVar11 * 2;
          (t1->mqc).c = OVar11;
          OVar9 = OVar9 - 1;
          (t1->mqc).ct = OVar9;
        } while (uVar12 < 0x8000);
      }
      else {
        (t1->mqc).c = uVar7 + uVar12 * -0x10000;
        if ((short)uVar15 < 0) {
          uVar7 = poVar2->mps;
        }
        else {
          uVar7 = (uint)(poVar2->mps == 0);
          if (uVar15 >= uVar12) {
            uVar7 = poVar2->mps;
          }
          *ppoVar13 = (&poVar2->nmps)[uVar15 < uVar12];
          OVar9 = (t1->mqc).ct;
          OVar11 = (t1->mqc).c;
          uVar12 = (t1->mqc).a;
          do {
            if (OVar9 == 0) {
              pOVar3 = (t1->mqc).bp;
              bVar6 = pOVar3[1];
              if (*pOVar3 == 0xff) {
                if (bVar6 < 0x90) {
                  (t1->mqc).bp = pOVar3 + 1;
                  OVar11 = OVar11 + (uint)bVar6 * 0x200;
                  (t1->mqc).c = OVar11;
                  (t1->mqc).ct = 7;
                  OVar9 = 7;
                  goto LAB_001345a0;
                }
                OVar11 = OVar11 + 0xff00;
                (t1->mqc).c = OVar11;
                (t1->mqc).ct = 8;
                pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                *pOVar1 = *pOVar1 + 1;
              }
              else {
                (t1->mqc).bp = pOVar3 + 1;
                OVar11 = OVar11 + (uint)bVar6 * 0x100;
                (t1->mqc).c = OVar11;
                (t1->mqc).ct = 8;
              }
              OVar9 = 8;
            }
LAB_001345a0:
            uVar12 = uVar12 * 2;
            (t1->mqc).a = uVar12;
            OVar11 = OVar11 * 2;
            (t1->mqc).c = OVar11;
            OVar9 = OVar9 - 1;
            (t1->mqc).ct = OVar9;
          } while (uVar12 < 0x8000);
        }
      }
      uVar12 = uVar7 ^ ""[uVar14];
      iVar10 = -oneplushalf;
      if (uVar7 == ""[uVar14]) {
        iVar10 = oneplushalf;
      }
      *datap = iVar10;
      flagsp[-1] = flagsp[-1] | 0x20 << (bVar5 & 0x1f);
      *flagsp = *flagsp | (uVar12 << 0x13 | 0x10) << (bVar5 & 0x1f);
      flagsp[1] = flagsp[1] | 8 << (bVar5 & 0x1f);
      if (vsc == 0 && ci == 0) {
        puVar8 = flagsp + -(ulong)(t1->w + 2);
        *puVar8 = uVar12 << 0x1f | *puVar8 | 0x10000;
        *(byte *)((long)puVar8 + -2) = *(byte *)((long)puVar8 + -2) | 2;
        *(byte *)((long)puVar8 + 5) = *(byte *)((long)puVar8 + 5) | 0x80;
      }
      if (ci == 3) {
        uVar4 = (ulong)(t1->w + 2);
        flagsp[uVar4] = uVar12 << 0x12 | flagsp[uVar4] | 2;
        *(byte *)(flagsp + (uVar4 - 1)) = (byte)flagsp[uVar4 - 1] | 4;
        *(byte *)(flagsp + uVar4 + 1) = (byte)flagsp[uVar4 + 1] | 1;
      }
    }
  }
  return;
}

Assistant:

static void opj_t1_dec_clnpass_step(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 oneplushalf,
    OPJ_UINT32 ci,
    OPJ_UINT32 vsc)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */
    opj_t1_dec_clnpass_step_macro(OPJ_TRUE, OPJ_FALSE,
                                  *flagsp, flagsp, t1->w + 2U, datap,
                                  0, ci, mqc, mqc->curctx,
                                  v, mqc->a, mqc->c, mqc->ct, oneplushalf, vsc);
}